

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O1

Point __thiscall ellipses::estimate_target_center(ellipses *this,Mat *pretreat,bool debug)

{
  undefined8 uVar1;
  undefined7 in_register_00000011;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  pointer pvVar2;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  undefined1 local_a8 [32];
  _InputArray local_88;
  undefined1 local_68 [32];
  undefined8 local_48;
  undefined4 local_40 [2];
  void **local_38;
  undefined8 uStack_30;
  
  if ((int)CONCAT71(in_register_00000011,debug) != 0) {
    pvVar2 = (pointer)(local_a8 + 0x10);
    local_a8._0_8_ = pvVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"gray","");
    cv::namedWindow((string *)local_a8,0);
    if ((pointer)local_a8._0_8_ != pvVar2) {
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                        *)local_a8._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    local_a8._0_8_ = pvVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"gray","");
    local_88.sz.width = 0;
    local_88.sz.height = 0;
    local_88.flags = 0x1010000;
    local_88.obj = pretreat;
    cv::imshow((string *)local_a8,&local_88);
    if ((pointer)local_a8._0_8_ != pvVar2) {
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                        *)local_a8._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    cv::waitKey(0);
  }
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_88.sz.width = 0;
  local_88.sz.height = 0;
  local_88.flags = 0x1010000;
  uStack_30 = 0;
  local_40[0] = 0x8204000c;
  local_48 = 0;
  local_88.obj = pretreat;
  local_38 = (void **)local_a8;
  cv::findContours(&local_88,local_40,1,2);
  uVar1 = local_a8._8_8_;
  local_88._0_8_ = (void *)0x0;
  local_88.obj = (void *)0x0;
  local_88.sz.width = 0;
  local_88.sz.height = 0;
  if (local_a8._0_8_ != local_a8._8_8_) {
    pvVar2 = (pointer)local_a8._0_8_;
    do {
      if ((ulong)((long)local_88.obj - local_88._0_8_) <
          (ulong)((long)(pvVar2->
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_move_assign
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_88,pvVar2);
      }
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != (pointer)uVar1);
  }
  uStack_30 = 0;
  local_40[0] = 0x8103000c;
  local_38 = (void **)&local_88;
  cv::fitEllipse((_InputArray *)local_68);
  *(int *)this = (int)ROUND((float)local_68._0_4_);
  *(int *)(this + 4) = (int)ROUND((float)local_68._4_4_);
  if ((void *)local_88._0_8_ != (void *)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_88.sz - local_88._0_8_);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_a8);
  return (Point)this;
}

Assistant:

cv::Point estimate_target_center(const cv::Mat& pretreat, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = std::move(v);
        }
    }

    return cv::fitEllipse(result).center;
}